

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O3

ssize_t __thiscall
FIX::ThreadedSocketConnection::send
          (ThreadedSocketConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  size_t length;
  long lVar1;
  ssize_t in_RAX;
  long lVar2;
  undefined4 in_register_00000034;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    length = ((long *)CONCAT44(in_register_00000034,__fd))[1];
    lVar3 = (long)(int)length;
    if (lVar3 <= lVar2) break;
    in_RAX = socket_send(this->m_socket,
                         (char *)(*(long *)CONCAT44(in_register_00000034,__fd) + lVar2),length);
    lVar1 = in_RAX + lVar2;
  } while (-1 < in_RAX);
  return CONCAT71((int7)((ulong)in_RAX >> 8),lVar3 <= lVar2);
}

Assistant:

bool ThreadedSocketConnection::send(const std::string &msg) {
  ssize_t totalSent = 0;
  while (totalSent < (int)msg.length()) {
    ssize_t sent = socket_send(m_socket, msg.c_str() + totalSent, msg.length());
    if (sent < 0) {
      return false;
    }
    totalSent += sent;
  }

  return true;
}